

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::js::anon_unknown_0::FileDeduplicator::AddFile
          (FileDeduplicator *this,string *filename,void *desc,string *error)

{
  string *psVar1;
  bool bVar2;
  mapped_type *ppvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Self local_40;
  _Self local_38;
  string *local_30;
  string *error_local;
  void *desc_local;
  string *filename_local;
  FileDeduplicator *this_local;
  
  local_30 = error;
  error_local = (string *)desc;
  desc_local = filename;
  filename_local = (string *)this;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
       ::find(&this->descs_by_filename_,filename);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
       ::end(&this->descs_by_filename_);
  bVar2 = std::operator!=(&local_38,&local_40);
  if (bVar2) {
    if ((this->error_on_conflict_ & 1U) != 0) {
      std::operator+(&local_80,"Name conflict: file name ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)desc_local
                    );
      std::operator+(&local_60,&local_80," would be generated by two descriptors");
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      return false;
    }
    ppvVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
              ::operator[](&this->descs_by_filename_,(key_type *)desc_local);
    std::set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>::erase
              (&this->allowed_descs_,ppvVar3);
  }
  psVar1 = error_local;
  ppvVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
            ::operator[](&this->descs_by_filename_,(key_type *)desc_local);
  *ppvVar3 = psVar1;
  std::set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_>::insert
            (&this->allowed_descs_,&error_local);
  return true;
}

Assistant:

bool AddFile(const string& filename, const void* desc, string* error) {
    if (descs_by_filename_.find(filename) != descs_by_filename_.end()) {
      if (error_on_conflict_) {
        *error = "Name conflict: file name " + filename +
                 " would be generated by two descriptors";
        return false;
      }
      allowed_descs_.erase(descs_by_filename_[filename]);
    }

    descs_by_filename_[filename] = desc;
    allowed_descs_.insert(desc);
    return true;
  }